

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int Fl::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  char *pcVar1;
  int in_EDX;
  int iVar2;
  Atom local_38;
  Atom property;
  char *type_local;
  int clipboard_local;
  int len_local;
  char *stuff_local;
  
  iVar2 = (int)src;
  if ((dst != (EVP_PKEY_CTX *)0x0) && (-1 < iVar2)) {
    if (in_EDX < 2) {
      if (fl_selection_buffer_length[in_EDX] < iVar2 + 1) {
        if (fl_selection_buffer[in_EDX] != (char *)0x0) {
          operator_delete__(fl_selection_buffer[in_EDX]);
        }
        pcVar1 = (char *)operator_new__((long)(iVar2 + 100));
        fl_selection_buffer[in_EDX] = pcVar1;
        fl_selection_buffer_length[in_EDX] = iVar2 + 100;
      }
      memcpy(fl_selection_buffer[in_EDX],dst,(long)iVar2);
      fl_selection_buffer[in_EDX][iVar2] = '\0';
      fl_selection_length[in_EDX] = iVar2;
      fl_i_own_selection[in_EDX] = '\x01';
      fl_selection_type[in_EDX] = "text/plain";
      if (in_EDX == 0) {
        local_38 = 1;
      }
      else {
        local_38 = CLIPBOARD;
      }
      in_EAX = XSetSelectionOwner(fl_display,local_38,fl_message_window,fl_event_time);
    }
    else {
      copy(dst,(EVP_PKEY_CTX *)((ulong)src & 0xffffffff));
      in_EAX = copy(dst,(EVP_PKEY_CTX *)((ulong)src & 0xffffffff));
    }
  }
  return in_EAX;
}

Assistant:

void Fl::copy(const char *stuff, int len, int clipboard, const char *type) {
  if (!stuff || len<0) return;

  if (clipboard >= 2) {
    copy(stuff, len, 0, type);
    copy(stuff, len, 1, type);
    return;
  }

  if (len+1 > fl_selection_buffer_length[clipboard]) {
    delete[] fl_selection_buffer[clipboard];
    fl_selection_buffer[clipboard] = new char[len+100];
    fl_selection_buffer_length[clipboard] = len+100;
  }
  memcpy(fl_selection_buffer[clipboard], stuff, len);
  fl_selection_buffer[clipboard][len] = 0; // needed for direct paste
  fl_selection_length[clipboard] = len;
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_plain_text;
  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}